

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O1

JSAMPARRAY alloc_sarray(j_common_ptr cinfo,int pool_id,JDIMENSION samplesperrow,JDIMENSION numrows)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  JSAMPARRAY ppJVar5;
  JSAMPROW pJVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  pjVar1 = cinfo->mem;
  if (1000000000 < samplesperrow) {
    *(undefined8 *)&cinfo->err->msg_code = 0x900000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  uVar10 = samplesperrow + 0x3f & 0xffffffc0;
  uVar11 = CONCAT44(0,uVar10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3b9ac9e8)) / auVar3,0);
  if (0x3b9ac9e8 < uVar10) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x46;
    (*pjVar2->error_exit)(cinfo);
  }
  if (numrows <= uVar4) {
    uVar4 = (ulong)numrows;
  }
  *(int *)&pjVar1[1].access_virt_sarray = (int)uVar4;
  ppJVar5 = (JSAMPARRAY)alloc_small(cinfo,pool_id,(ulong)numrows << 3);
  if (numrows != 0) {
    uVar10 = 0;
    do {
      uVar9 = (ulong)(numrows - uVar10);
      if ((uint)uVar4 < numrows - uVar10) {
        uVar9 = uVar4;
      }
      pJVar6 = (JSAMPROW)alloc_large(cinfo,pool_id,uVar9 * uVar11);
      uVar7 = (uint)uVar9;
      uVar4 = uVar9;
      while (uVar7 != 0) {
        uVar8 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        ppJVar5[uVar8] = pJVar6;
        pJVar6 = pJVar6 + uVar11;
        uVar7 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar7;
      }
      uVar4 = uVar9;
    } while (uVar10 < numrows);
  }
  return ppJVar5;
}

Assistant:

METHODDEF(JSAMPARRAY)
alloc_sarray(j_common_ptr cinfo, int pool_id, JDIMENSION samplesperrow,
             JDIMENSION numrows)
/* Allocate a 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  JSAMPARRAY result;
  JSAMPROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Make sure each row is properly aligned */
  if ((ALIGN_SIZE % sizeof(JSAMPLE)) != 0)
    out_of_memory(cinfo, 5);    /* safety check */

  if (samplesperrow > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 9);
  }
  samplesperrow = (JDIMENSION)round_up_pow2(samplesperrow, (2 * ALIGN_SIZE) /
                                                           sizeof(JSAMPLE));

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK - sizeof(large_pool_hdr)) /
          ((long)samplesperrow * sizeof(JSAMPLE));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long)numrows)
    rowsperchunk = (JDIMENSION)ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JSAMPARRAY)alloc_small(cinfo, pool_id,
                                   (size_t)(numrows * sizeof(JSAMPROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JSAMPROW)alloc_large(cinfo, pool_id,
      (size_t)((size_t)rowsperchunk * (size_t)samplesperrow *
               sizeof(JSAMPLE)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += samplesperrow;
    }
  }

  return result;
}